

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.hpp
# Opt level: O1

bool tao::pegtl::internal::
     istring<(char)68,(char)97,(char)116,(char)97,(char)32,(char)84,(char)101,(char)120,(char)116>::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  iterator_t *piVar1;
  size_t *psVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar3 = (byte *)(in->
                   super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).m_current.data;
  if (((8 < (ulong)((long)(in->
                          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_end - (long)pbVar3)) && ((*pbVar3 & 0xdf) == 0x44)) &&
     (bVar4 = istring_equal<'a',_'t',_'a',_'_',_'T',_'e',_'x',_'t'>::match((char *)(pbVar3 + 1)),
     bVar4)) {
    piVar1 = &(in->
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_current;
    piVar1->data = piVar1->data + 9;
    psVar2 = &(in->
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_current.byte;
    *psVar2 = *psVar2 + 9;
    psVar2 = &(in->
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_current.byte_in_line;
    *psVar2 = *psVar2 + 9;
    return true;
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.size( 0 ) ) )
            {
               if( in.size( sizeof...( Cs ) ) >= sizeof...( Cs ) ) {
                  if( istring_equal< Cs... >::match( in.current() ) ) {
                     bump_help< result_on_found::success, Input, char, Cs... >( in, sizeof...( Cs ) );
                     return true;
                  }
               }
               return false;
            }